

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O3

bool __thiscall
lambertian::scatter(lambertian *this,ray *r_in,hit_record *rec,vec3 *attenuation,ray *scattered,
                   double *pdf)

{
  double dVar1;
  element_type *peVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  onb uvw;
  onb local_98;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_98.axis[2].e[0] = 0.0;
  local_98.axis[2].e[1] = 0.0;
  local_98.axis[1].e[1] = 0.0;
  local_98.axis[1].e[2] = 0.0;
  local_98.axis[0].e[2] = 0.0;
  local_98.axis[1].e[0] = 0.0;
  local_98.axis[0].e[0] = 0.0;
  local_98.axis[0].e[1] = 0.0;
  local_98.axis[2].e[2] = 0.0;
  onb::build_from_w(&local_98,&rec->normal);
  iVar12 = rand();
  iVar13 = rand();
  dVar14 = (double)iVar13 * 4.656612873077393e-10;
  if (1.0 - dVar14 < 0.0) {
    sqrt(1.0 - dVar14);
  }
  dVar16 = (double)iVar12 * 4.656612873077393e-10 * 6.283185307179586;
  cos(dVar16);
  if (dVar14 < 0.0) {
    sqrt(dVar14);
  }
  sin(dVar16);
  if (dVar14 < 0.0) {
    sqrt(dVar14);
  }
  dVar11 = local_98.axis[2].e[0];
  iVar12 = rand();
  dVar15 = (double)iVar12 * 4.656612873077393e-10 * 6.283185307179586 + 0.0;
  iVar12 = rand();
  dVar14 = (double)iVar12 * 4.656612873077393e-10 + (double)iVar12 * 4.656612873077393e-10 + -1.0;
  dVar16 = 1.0 - dVar14 * dVar14;
  if (dVar16 < 0.0) {
    dVar16 = sqrt(dVar16);
  }
  else {
    dVar16 = SQRT(dVar16);
  }
  dVar4 = cos(dVar15);
  dVar5 = sin(dVar15);
  dVar15 = (rec->normal).e[2];
  dVar1 = r_in->tm;
  dVar7 = (rec->normal).e[0];
  dVar6 = (rec->normal).e[1] + dVar5 * dVar16;
  dVar5 = (rec->p).e[2];
  uVar8 = *(undefined4 *)((long)(rec->p).e + 4);
  uVar9 = *(undefined4 *)((rec->p).e + 1);
  uVar10 = *(undefined4 *)((long)(rec->p).e + 0xc);
  *(undefined4 *)(scattered->orig).e = *(undefined4 *)(rec->p).e;
  *(undefined4 *)((long)(scattered->orig).e + 4) = uVar8;
  *(undefined4 *)((scattered->orig).e + 1) = uVar9;
  *(undefined4 *)((long)(scattered->orig).e + 0xc) = uVar10;
  (scattered->orig).e[2] = dVar5;
  auVar3._8_4_ = SUB84(dVar6,0);
  auVar3._0_8_ = dVar7 + dVar4 * dVar16;
  auVar3._12_4_ = (int)((ulong)dVar6 >> 0x20);
  *(undefined1 (*) [16])(scattered->dir).e = auVar3;
  (scattered->dir).e[2] = dVar14 + dVar15;
  scattered->tm = dVar1;
  peVar2 = (this->albedo).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**peVar2->_vptr_texture)(SUB84(rec->u,0),rec->v,&local_48,peVar2,rec);
  attenuation->e[2] = local_38;
  attenuation->e[0] = local_48;
  attenuation->e[1] = dStack_40;
  *pdf = (local_98.axis[2].e[2] * (scattered->dir).e[2] +
         dVar11 * (scattered->dir).e[0] + local_98.axis[2].e[1] * (scattered->dir).e[1]) /
         3.141592653589793;
  return true;
}

Assistant:

virtual bool scatter(
            const ray& r_in, const hit_record& rec, vec3& attenuation, ray& scattered, double& pdf
    ) const {
        onb uvw;
        uvw.build_from_w(rec.normal);
        auto direction = uvw.local(random_cosine_direction());
        vec3 scatter_direction = rec.normal + random_unit_vector();
        scattered = ray(rec.p, scatter_direction, r_in.time());
        attenuation = albedo->value(rec.u, rec.v, rec.p);
        pdf = dot(uvw.w(), scattered.direction()) / pi;
        return true;
    }